

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xvector.c
# Opt level: O1

void xvec_erase(xvec_t *xv,size_t pos,int count)

{
  ulong uVar1;
  int iVar2;
  uchar *puVar3;
  
  if (-1 < count) {
    uVar1 = (uint)count + pos;
    if (uVar1 < xv->size) {
      xv->size = xv->size - (ulong)(uint)count;
      if (xv->destroy_cb == (xvec_destroy_cb)0x0) {
        puVar3 = xv->data + xv->val_size * uVar1;
      }
      else {
        puVar3 = xv->data + xv->val_size * pos;
        if (count != 0) {
          iVar2 = count + 1;
          do {
            (*xv->destroy_cb)(puVar3);
            puVar3 = puVar3 + xv->val_size;
            iVar2 = iVar2 + -1;
          } while (1 < iVar2);
        }
      }
      memmove(xv->data + xv->val_size * pos,puVar3,(xv->size - pos) * xv->val_size);
      return;
    }
  }
  if (xv->destroy_cb != (xvec_destroy_cb)0x0) {
    iVar2 = (int)xv->size;
    if (0 < iVar2 - (int)pos) {
      puVar3 = xv->data + xv->val_size * pos;
      iVar2 = (iVar2 - (int)pos) + 1;
      do {
        (*xv->destroy_cb)(puVar3);
        puVar3 = puVar3 + xv->val_size;
        iVar2 = iVar2 + -1;
      } while (1 < iVar2);
    }
  }
  xv->size = pos;
  return;
}

Assistant:

void xvec_erase(xvec_t* xv, size_t pos, int count)
{
    unsigned char* v;

    if (count < 0 || pos + count >= xv->size)
    {
        if (xv->destroy_cb)
            values_destroy(xv, pos, xv->size - pos);

        xv->size = pos;
    }
    else
    {
        xv->size -= count;

        if (xv->destroy_cb)
            v = values_destroy(xv, pos, count);
        else
            v = xvec_at(xv, pos + count);

        /* <<< */
        memmove(xvec_at(xv, pos), v,
                xv->val_size * (xv->size - pos));
    }
}